

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddRanlibRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  bool bVar1;
  TargetType TVar2;
  cmMakefile *this_00;
  string *psVar3;
  ostream *poVar4;
  allocator<char> local_49;
  string local_48;
  
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if (TVar2 == STATIC_LIBRARY) {
    bVar1 = cmGeneratorTarget::IsApple(this->Target);
    if (bVar1) {
      this_00 = cmTarget::GetMakefile(this->Target->Target);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"CMAKE_RANLIB",&local_49);
      psVar3 = cmMakefile::GetRequiredDefinition(this_00,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      if (psVar3->_M_string_length != 0) {
        poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
        poVar4 = std::operator<<(poVar4,"execute_process(COMMAND \"");
        poVar4 = std::operator<<(poVar4,(string *)psVar3);
        poVar4 = std::operator<<(poVar4,"\" \"");
        poVar4 = std::operator<<(poVar4,(string *)toDestDirPath);
        std::operator<<(poVar4,"\")\n");
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddRanlibRule(std::ostream& os, Indent indent,
                                             const std::string& toDestDirPath)
{
  // Static libraries need ranlib on this platform.
  if (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    return;
  }

  // Perform post-installation processing on the file depending
  // on its type.
  if (!this->Target->IsApple()) {
    return;
  }

  const std::string& ranlib =
    this->Target->Target->GetMakefile()->GetRequiredDefinition("CMAKE_RANLIB");
  if (ranlib.empty()) {
    return;
  }

  os << indent << "execute_process(COMMAND \"" << ranlib << "\" \""
     << toDestDirPath << "\")\n";
}